

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall
llvm::cl::parser<float>::printOptionDiff
          (parser<float> *this,Option *O,float V,OptionValue<float> *D,size_t GlobalWidth)

{
  OptionValue<float> OVar1;
  raw_ostream *prVar2;
  uint NumSpaces;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  string Str;
  raw_string_ostream SS;
  string local_80;
  raw_string_ostream local_60;
  
  basic_parser_impl::printOptionName((basic_parser_impl *)this,O,GlobalWidth);
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_60.super_raw_ostream.BufferMode = InternalBuffer;
  local_60.super_raw_ostream.OutBufStart = (char *)0x0;
  local_60.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_60.super_raw_ostream.OutBufCur = (char *)0x0;
  local_60.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_001d7238;
  local_60.OS = &local_80;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  raw_ostream::operator<<(&local_60.super_raw_ostream,(double)V);
  raw_string_ostream::~raw_string_ostream(&local_60);
  prVar2 = outs();
  Str_00.Length = 2;
  Str_00.Data = "= ";
  prVar2 = raw_ostream::operator<<(prVar2,Str_00);
  raw_ostream::write(prVar2,(int)local_80._M_dataplus._M_p,(void *)local_80._M_string_length,
                     GlobalWidth);
  NumSpaces = 8 - (int)local_80._M_string_length;
  if ((void *)0x7 < local_80._M_string_length) {
    NumSpaces = 0;
  }
  prVar2 = outs();
  prVar2 = raw_ostream::indent(prVar2,NumSpaces);
  Str_01.Length = 0xb;
  Str_01.Data = " (default: ";
  raw_ostream::operator<<(prVar2,Str_01);
  OVar1 = D[0xc];
  prVar2 = outs();
  if (OVar1 == (OptionValue<float>)0x1) {
    if (D[0xc] == (OptionValue<float>)0x0) {
      __assert_fail("Valid && \"invalid option value\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/CommandLine.h"
                    ,0x1fc,
                    "const DataType &llvm::cl::OptionValueCopy<float>::getValue() const [DataType = float]"
                   );
    }
    raw_ostream::operator<<(prVar2,(double)*(float *)(D + 8));
  }
  else {
    Str_02.Length = 0xc;
    Str_02.Data = "*no default*";
    raw_ostream::operator<<(prVar2,Str_02);
  }
  prVar2 = outs();
  Str_03.Length = 2;
  Str_03.Data = ")\n";
  raw_ostream::operator<<(prVar2,Str_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void parser<std::string>::printOptionDiff(const Option &O, StringRef V,
                                          const OptionValue<std::string> &D,
                                          size_t GlobalWidth) const {
  printOptionName(O, GlobalWidth);
  outs() << "= " << V;
  size_t NumSpaces = MaxOptWidth > V.size() ? MaxOptWidth - V.size() : 0;
  outs().indent(NumSpaces) << " (default: ";
  if (D.hasValue())
    outs() << D.getValue();
  else
    outs() << "*no default*";
  outs() << ")\n";
}